

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O0

void __thiscall fdtd_solver::advance_e(fdtd_solver *this)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  cellb ***pppcVar9;
  cellj ***pppcVar10;
  celle ***pppcVar11;
  long in_RDI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int k_3;
  int j_3;
  int i_3;
  int k_2;
  int j_2;
  int i_2;
  int k_1;
  int j_1;
  int i_1;
  int k;
  int j;
  int i;
  int nz;
  int ny;
  int nx;
  int in_stack_fffffffffffffe5c;
  field3d<cellb> *in_stack_fffffffffffffe60;
  int local_40;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  int local_18;
  
  iVar6 = field3d<celle>::get_nx(*(field3d<celle> **)(in_RDI + 8));
  iVar7 = field3d<celle>::get_ny(*(field3d<celle> **)(in_RDI + 8));
  iVar8 = field3d<celle>::get_nz(*(field3d<celle> **)(in_RDI + 8));
  for (local_18 = 1; local_18 < iVar6 + -1; local_18 = local_18 + 1) {
    for (local_1c = 1; local_1c < iVar7 + -1; local_1c = local_1c + 1) {
      for (local_20 = 1; local_20 < iVar8 + -1; local_20 = local_20 + 1) {
        uVar1 = *(ulong *)(in_RDI + 0x40);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar2 = (*pppcVar9)[local_1c][local_20].bz;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar3 = (*pppcVar9)[local_1c + -1][local_20].bz;
        dVar4 = *(double *)(in_RDI + 0x48);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar5 = (*pppcVar9)[local_1c][local_20].by;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar2 - dVar3;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar1;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = -(dVar4 * (dVar5 - (*pppcVar9)[local_1c][local_20 + -1].by));
        auVar22 = vfmadd213sd_fma(auVar12,auVar24,auVar36);
        pppcVar10 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        auVar37._8_8_ = 0;
        auVar37._0_8_ = auVar22._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)(in_RDI + 0x20);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = -(*pppcVar10)[local_1c][local_20].jx;
        auVar22 = vfmadd213sd_fma(auVar13,auVar25,auVar37);
        pppcVar11 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        (*pppcVar11)[local_1c][local_20].ex = auVar22._0_8_ + (*pppcVar11)[local_1c][local_20].ex;
        uVar1 = *(ulong *)(in_RDI + 0x38);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar2 = (*pppcVar9)[local_1c][local_20].bz;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar3 = (*pppcVar9)[local_1c][local_20].bz;
        dVar4 = *(double *)(in_RDI + 0x48);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar5 = (*pppcVar9)[local_1c][local_20].bx;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar2 - dVar3;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar1 ^ 0x8000000000000000;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar4 * (dVar5 - (*pppcVar9)[local_1c][local_20 + -1].bx);
        auVar22 = vfmadd213sd_fma(auVar14,auVar26,auVar38);
        pppcVar10 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auVar22._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(in_RDI + 0x28);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = -(*pppcVar10)[local_1c][local_20].jy;
        auVar22 = vfmadd213sd_fma(auVar15,auVar27,auVar39);
        pppcVar11 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        (*pppcVar11)[local_1c][local_20].ey = auVar22._0_8_ + (*pppcVar11)[local_1c][local_20].ey;
        uVar1 = *(ulong *)(in_RDI + 0x38);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar2 = (*pppcVar9)[local_1c][local_20].by;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar3 = (*pppcVar9)[local_1c][local_20].by;
        dVar4 = *(double *)(in_RDI + 0x40);
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        dVar5 = (*pppcVar9)[local_1c][local_20].bx;
        pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar2 - dVar3;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar1;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = -(dVar4 * (dVar5 - (*pppcVar9)[local_1c + -1][local_20].bx));
        auVar22 = vfmadd213sd_fma(auVar16,auVar28,auVar40);
        pppcVar10 = field3d<cellj>::operator[]
                              ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        auVar41._8_8_ = 0;
        auVar41._0_8_ = auVar22._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)(in_RDI + 0x30);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = -(*pppcVar10)[local_1c][local_20].jz;
        auVar22 = vfmadd213sd_fma(auVar17,auVar29,auVar41);
        pppcVar11 = field3d<celle>::operator[]
                              ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                              );
        (*pppcVar11)[local_1c][local_20].ez = auVar22._0_8_ + (*pppcVar11)[local_1c][local_20].ez;
      }
    }
  }
  for (local_28 = 1; local_28 < iVar7 + -1; local_28 = local_28 + 1) {
    for (local_2c = 1; local_2c < iVar8 + -1; local_2c = local_2c + 1) {
      uVar1 = *(ulong *)(in_RDI + 0x40);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar2 = (*pppcVar9)[local_28][local_2c].bz;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar3 = (*pppcVar9)[local_28 + -1][local_2c].bz;
      dVar4 = *(double *)(in_RDI + 0x48);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar5 = (*pppcVar9)[local_28][local_2c].by;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar2 - dVar3;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar1;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = -(dVar4 * (dVar5 - (*pppcVar9)[local_28][local_2c + -1].by));
      auVar22 = vfmadd213sd_fma(auVar18,auVar30,auVar42);
      pppcVar10 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = auVar22._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(in_RDI + 0x20);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = -(*pppcVar10)[local_28][local_2c].jx;
      auVar22 = vfmadd213sd_fma(auVar19,auVar31,auVar43);
      pppcVar11 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      (*pppcVar11)[local_28][local_2c].ex = auVar22._0_8_ + (*pppcVar11)[local_28][local_2c].ex;
    }
  }
  for (local_30 = 1; local_30 < iVar6 + -1; local_30 = local_30 + 1) {
    for (local_38 = 1; local_38 < iVar8 + -1; local_38 = local_38 + 1) {
      uVar1 = *(ulong *)(in_RDI + 0x38);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar2 = (**pppcVar9)[local_38].bz;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar3 = (**pppcVar9)[local_38].bz;
      dVar4 = *(double *)(in_RDI + 0x48);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar5 = (**pppcVar9)[local_38].bx;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar2 - dVar3;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar1 ^ 0x8000000000000000;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar4 * (dVar5 - (**pppcVar9)[local_38 + -1].bx);
      auVar22 = vfmadd213sd_fma(auVar20,auVar32,auVar44);
      pppcVar10 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar22._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(in_RDI + 0x28);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = -(**pppcVar10)[local_38].jy;
      auVar22 = vfmadd213sd_fma(auVar21,auVar33,auVar45);
      pppcVar11 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      (**pppcVar11)[local_38].ey = auVar22._0_8_ + (**pppcVar11)[local_38].ey;
    }
  }
  for (local_3c = 1; local_3c < iVar6 + -1; local_3c = local_3c + 1) {
    for (local_40 = 1; local_40 < iVar7 + -1; local_40 = local_40 + 1) {
      uVar1 = *(ulong *)(in_RDI + 0x38);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      in_stack_fffffffffffffe60 = (field3d<cellb> *)(*pppcVar9)[local_40]->by;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar4 = (double)in_stack_fffffffffffffe60 - (*pppcVar9)[local_40]->by;
      dVar2 = *(double *)(in_RDI + 0x40);
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      dVar3 = (*pppcVar9)[local_40]->bx;
      pppcVar9 = field3d<cellb>::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar4;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar1;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = -(dVar2 * (dVar3 - (*pppcVar9)[local_40 + -1]->bx));
      auVar22 = vfmadd213sd_fma(auVar22,auVar34,auVar46);
      pppcVar10 = field3d<cellj>::operator[]
                            ((field3d<cellj> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = auVar22._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)(in_RDI + 0x30);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = -(*pppcVar10)[local_40]->jz;
      auVar22 = vfmadd213sd_fma(auVar23,auVar35,auVar47);
      pppcVar11 = field3d<celle>::operator[]
                            ((field3d<celle> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      (*pppcVar11)[local_40]->ez = auVar22._0_8_ + (*pppcVar11)[local_40]->ez;
    }
  }
  return;
}

Assistant:

void fdtd_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=0;
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        {int j=0;
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            {int k=0;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
}